

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void SparseKeygenRecurse<Blob<1536>,Blob<160>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<1536> *k,
               vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  Blob<160> h;
  Blob<160> local_44;
  
  Blob<160>::Blob(&local_44);
  while (start < 0x600) {
    flipbit(k,0xc0,start);
    if (bitsleft == 1 || inclusive) {
      (*hash)(k,0xc0,0,&local_44);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,&local_44);
    }
    if (1 < bitsleft) {
      SparseKeygenRecurse<Blob<1536>,Blob<160>>(hash,start + 1U,bitsleft + -1,inclusive,k,hashes);
    }
    flipbit(k,0xc0,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}